

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int xmlParseLookupGt(xmlParserCtxtPtr ctxt)

{
  ulong uVar1;
  size_t index;
  int state;
  xmlChar *end;
  xmlChar *cur;
  xmlParserCtxtPtr ctxt_local;
  
  index._4_4_ = ctxt->endCheckState;
  if (ctxt->checkIndex == 0) {
    end = ctxt->input->cur + 1;
  }
  else {
    end = ctxt->input->cur + ctxt->checkIndex;
  }
  do {
    if (ctxt->input->end <= end) {
      uVar1 = (long)end - (long)ctxt->input->cur;
      if (uVar1 < 0x8000000000000000) {
        ctxt->checkIndex = uVar1;
        ctxt->endCheckState = index._4_4_;
      }
      else {
        ctxt->checkIndex = 0;
        ctxt->endCheckState = 0;
      }
      ctxt_local._4_4_ = (uint)(uVar1 >= 0x8000000000000000);
      return ctxt_local._4_4_;
    }
    if (index._4_4_ == 0) {
      if ((*end == '\'') || (*end == '\"')) {
        index._4_4_ = (uint)*end;
      }
      else if (*end == '>') {
        ctxt->checkIndex = 0;
        ctxt->endCheckState = 0;
        return 1;
      }
    }
    else if (*end == index._4_4_) {
      index._4_4_ = 0;
    }
    end = end + 1;
  } while( true );
}

Assistant:

static int
xmlParseLookupGt(xmlParserCtxtPtr ctxt) {
    const xmlChar *cur;
    const xmlChar *end = ctxt->input->end;
    int state = ctxt->endCheckState;
    size_t index;

    if (ctxt->checkIndex == 0)
        cur = ctxt->input->cur + 1;
    else
        cur = ctxt->input->cur + ctxt->checkIndex;

    while (cur < end) {
        if (state) {
            if (*cur == state)
                state = 0;
        } else if (*cur == '\'' || *cur == '"') {
            state = *cur;
        } else if (*cur == '>') {
            ctxt->checkIndex = 0;
            ctxt->endCheckState = 0;
            return(1);
        }
        cur++;
    }

    index = cur - ctxt->input->cur;
    if (index > LONG_MAX) {
        ctxt->checkIndex = 0;
        ctxt->endCheckState = 0;
        return(1);
    }
    ctxt->checkIndex = index;
    ctxt->endCheckState = state;
    return(0);
}